

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidonlyContainsUserCertsCRLTest11<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section14InvalidonlyContainsUserCertsCRLTest11
          (Section14InvalidonlyContainsUserCertsCRLTest11<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidonlyContainsUserCertsCRLTest11) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "onlyContainsUserCertsCACert",
                               "InvalidonlyContainsUserCertsTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "onlyContainsUserCertsCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.11";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}